

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O1

void __thiscall cppforth::Forth::see(Forth *this)

{
  undefined1 *puVar1;
  ForthStack<unsigned_int> *this_00;
  code *pcVar2;
  long lVar3;
  uint uVar4;
  Cell CVar5;
  Definition *pDVar6;
  ostream *poVar7;
  size_type sVar8;
  char *pcVar9;
  string local_50;
  
  requireDStackAvailable(this,1,"BL");
  this_00 = &this->dStack;
  ForthStack<unsigned_int>::push(this_00,0x20);
  word(this);
  find(this);
  uVar4 = ForthStack<unsigned_int>::getTop(this_00);
  ForthStack<unsigned_int>::pop(this_00);
  if (uVar4 == 0) {
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"SEE: undefined word","");
    throwMessage(this,&local_50,errorParsedStringOverflow);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p == &local_50.field_2) {
      return;
    }
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    return;
  }
  uVar4 = ForthStack<unsigned_int>::getTop(this_00);
  ForthStack<unsigned_int>::pop(this_00);
  pDVar6 = getDefinition(this,uVar4);
  pcVar2 = (code *)pDVar6->code;
  if (pcVar2 == doColon && *(long *)&pDVar6->field_0x8 == 0) {
    CVar5 = dataSpaceAtCell(this,this->VarOffsetNumericBase);
    lVar3 = *(long *)(*(long *)&this->field_0x20 + -0x18);
    if (CVar5 == 8) {
      uVar4 = 0x40;
    }
    else if (CVar5 == 10) {
      uVar4 = 2;
    }
    else {
      uVar4 = (uint)(CVar5 == 0x10) << 3;
    }
    *(uint *)(&this->field_0x38 + lVar3) = *(uint *)(&this->field_0x38 + lVar3) & 0xffffffb5 | uVar4
    ;
    std::ostream::operator<<((ostream *)&this->field_0x20,pDVar6->does);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&this->field_0x20," : ",3);
    pcVar9 = (pDVar6->name)._M_dataplus._M_p;
    sVar8 = (pDVar6->name)._M_string_length;
  }
  else {
    puVar1 = &this->field_0x20;
    if (pcVar2 != doDoes && pcVar2 != doCreate || *(long *)&pDVar6->field_0x8 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1,": ",2);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)puVar1,(pDVar6->name)._M_dataplus._M_p,
                          (pDVar6->name)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," <primitive ",0xc);
      CVar5 = dataSpaceAtCell(this,this->VarOffsetNumericBase);
      if (CVar5 == 8) {
        uVar4 = 0x40;
      }
      else if (CVar5 == 10) {
        uVar4 = 2;
      }
      else {
        uVar4 = (uint)(CVar5 == 0x10) << 3;
      }
      *(uint *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x18) =
           *(uint *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x18) & 0xffffffb5 | uVar4;
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"addr of proc is not defined ",0x1c)
      ;
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"> ;",3);
      goto LAB_00118b68;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1,"CREATE ",7);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)puVar1,(pDVar6->name)._M_dataplus._M_p,
                        (pDVar6->name)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," ( ",3);
    poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," )",2);
    if (((code *)pDVar6->code != doDoes) || (*(long *)&pDVar6->field_0x8 != 0)) goto LAB_00118b68;
    pcVar9 = " DOES>";
    sVar8 = 6;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&this->field_0x20,pcVar9,sVar8);
  seeDoes(this,pDVar6->does);
LAB_00118b68:
  if ((pDVar6->flags & pDVar6->FlagImmediate) == 0) {
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&this->field_0x20," immediate",10);
  return;
}

Assistant:

void see() {
			bl(); word(); find();

			auto found = dStack.getTop(); pop();
			if (!found) {
				throwMessage("SEE: undefined word",errorParsedStringOverflow);
				return;
			}
			auto xt=XT(dStack.getTop()); dStack.pop();
			auto defn = getDefinition(xt); 
			if ((defn)->code == &Forth::doColon) {
#ifndef FORTHSCRIPTCPP_DISABLE_OUTPUT
				std_cout <<  SETBASE() << static_cast<SCell>(defn->does);
				std_cout << " : " << (defn)->name;
#endif
				seeDoes((defn)->does);
			}
			else if ((defn)->code == &Forth::doCreate || defn->code == &Forth::doDoes) {
#ifndef FORTHSCRIPTCPP_DISABLE_OUTPUT
				std_cout << "CREATE " << defn->name << " ( " << CELL(defn->parameter) << " )";
				if (defn->code == &Forth::doDoes) {
					std_cout << " DOES>";
					seeDoes(defn->does);
				}
#endif
			}
			else {
#ifndef FORTHSCRIPTCPP_DISABLE_OUTPUT
				std_cout << ": " << defn->name << " <primitive " << SETBASE() << "addr of proc is not defined " << "> ;";
#endif
			}
#ifndef FORTHSCRIPTCPP_DISABLE_OUTPUT
			if (defn->isImmediate()) std_cout << " immediate";
#endif
		}